

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_node.cpp
# Opt level: O2

void __thiscall sequence_node_double_true_Test::TestBody(sequence_node_double_true_Test *this)

{
  _Rb_tree_header *this_00;
  char *pcVar1;
  AssertHelper local_170;
  AssertHelper local_168;
  undefined1 local_160 [8];
  test_agent agent;
  test_agent_proxy ap;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  test_generator gen;
  
  test_generator::test_generator(&gen);
  ranger::bhvr_tree::
  xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
  ::generate((xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
              *)local_160,(char *)&gen);
  agent.m_true_counter = 0;
  testing::internal::
  CmpHelperNE<decltype(nullptr),std::unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>,std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>>>>
            ((internal *)&ap,"nullptr","root",(void **)&agent,
             (unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
              *)local_160);
  if (ap.
      super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
      .m_counters._M_t._M_impl._0_1_ == '\0') {
    testing::Message::Message((Message *)&agent);
    if ((undefined8 *)
        CONCAT44(ap.
                 super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                 .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                 ap.
                 super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                 .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._M_color) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT44(ap.
                                  super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                                  .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                                  ap.
                                  super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                                  .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._M_color)
      ;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/test/sequence_node.cpp"
               ,0x28,pcVar1);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&agent);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&agent);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&ap.
                    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                    .m_counters._M_t._M_impl.super__Rb_tree_header);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&ap.
                    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                    .m_counters._M_t._M_impl.super__Rb_tree_header);
    agent.m_true_counter = 0;
    agent.m_false_counter = 0;
    local_168.data_._0_4_ = 0;
    local_170.data_ = (AssertHelperData *)0x0;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&ap,"0","agent.get_true_counter()",(int *)&local_168,
               (unsigned_long *)&local_170);
    if (ap.
        super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
        .m_counters._M_t._M_impl._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_170);
      if ((undefined8 *)
          CONCAT44(ap.
                   super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                   .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                   ap.
                   super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                   .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._M_color) ==
          (undefined8 *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)CONCAT44(ap.
                                    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                                    .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                                    ap.
                                    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                                    .m_counters._M_t._M_impl.super__Rb_tree_header._M_header.
                                    _M_color);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/test/sequence_node.cpp"
                 ,0x2b,pcVar1);
      testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_170);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&ap.
                    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                    .m_counters._M_t._M_impl.super__Rb_tree_header);
    local_168.data_._0_4_ = 0;
    local_170.data_ = (AssertHelperData *)0x0;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&ap,"0","agent.get_false_counter()",(int *)&local_168,
               (unsigned_long *)&local_170);
    if (ap.
        super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
        .m_counters._M_t._M_impl._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_170);
      if ((undefined8 *)
          CONCAT44(ap.
                   super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                   .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                   ap.
                   super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                   .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._M_color) ==
          (undefined8 *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)CONCAT44(ap.
                                    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                                    .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                                    ap.
                                    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                                    .m_counters._M_t._M_impl.super__Rb_tree_header._M_header.
                                    _M_color);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/test/sequence_node.cpp"
                 ,0x2c,pcVar1);
      testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_170);
    }
    this_00 = &ap.
               super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
               .m_counters._M_t._M_impl.super__Rb_tree_header;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
    ap.
    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
    .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    ap.
    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
    .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ap.
    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
    .m_counters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ap.
    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
    .m_time_points._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &ap.
          super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
          .m_time_points._M_t._M_impl.super__Rb_tree_header._M_header;
    ap.
    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
    .m_time_points._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    ap.
    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
    .m_time_points._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ap.
    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
    .m_time_points._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_8_ = 0;
    local_b0 = std::
               _Function_handler<void_(bool,_test_agent_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/test/sequence_node.cpp:47:18)>
               ::_M_invoke;
    local_b8 = std::
               _Function_handler<void_(bool,_test_agent_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/test/sequence_node.cpp:47:18)>
               ::_M_manager;
    ap.
    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
    .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &this_00->_M_header;
    ap.
    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
    .m_counters._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &this_00->_M_header;
    ap.
    super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
    .m_time_points._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         ap.
         super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
         .m_time_points._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    ap.m_agent = &agent;
    (**(code **)(*(_func_int **)local_160 + 0x10))(local_160,&ap);
    std::_Function_base::~_Function_base((_Function_base *)&local_c8);
    ranger::bhvr_tree::detail::
    agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
    ::~agent_proxy_base(&ap.
                         super_agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                       );
  }
  if ((__uniq_ptr_impl<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
       )local_160 !=
      (__uniq_ptr_impl<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
       )0x0) {
    (**(code **)(*(_func_int **)local_160 + 8))();
  }
  ranger::bhvr_tree::abstract_generator<$86869e04$>::~abstract_generator
            ((abstract_generator<_86869e04_> *)&gen);
  return;
}

Assistant:

TEST(sequence_node, double_true) {
  test_generator gen;
  auto root = gen.generate(
    "<bhvr_tree class = \"sequence_node\">"
      "<bhvr_tree class = \"true_node\"/>"
      "<bhvr_tree class = \"true_node\"/>"
    "</bhvr_tree>"
  );
  ASSERT_NE(nullptr, root);

  test_agent agent;
  EXPECT_EQ(0, agent.get_true_counter());
  EXPECT_EQ(0, agent.get_false_counter());

  test_agent_proxy ap(agent);
  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_TRUE(result);
    EXPECT_EQ(2, agent->get_true_counter());
    EXPECT_EQ(0, agent->get_false_counter());
  });
}